

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_status64(int op,sqlite3_int64 *pCurrent,sqlite3_int64 *pHighwater,int resetFlag)

{
  sqlite3_mutex *local_38;
  sqlite3_mutex *pMutex;
  int resetFlag_local;
  sqlite3_int64 *pHighwater_local;
  sqlite3_int64 *pCurrent_local;
  int op_local;
  
  if ((op < 0) || (9 < op)) {
    pCurrent_local._4_4_ = sqlite3MisuseError(0x50c5);
  }
  else {
    if (""[op] == '\0') {
      local_38 = sqlite3MallocMutex();
    }
    else {
      local_38 = sqlite3Pcache1Mutex();
    }
    sqlite3_mutex_enter(local_38);
    *pCurrent = sqlite3Stat.nowValue[op];
    *pHighwater = sqlite3Stat.mxValue[op];
    if (resetFlag != 0) {
      sqlite3Stat.mxValue[op] = sqlite3Stat.nowValue[op];
    }
    sqlite3_mutex_leave(local_38);
    pCurrent_local._4_4_ = 0;
  }
  return pCurrent_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_status64(
  int op,
  sqlite3_int64 *pCurrent,
  sqlite3_int64 *pHighwater,
  int resetFlag
){
  sqlite3_mutex *pMutex;
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCurrent==0 || pHighwater==0 ) return SQLITE_MISUSE_BKPT;
#endif
  pMutex = statMutex[op] ? sqlite3Pcache1Mutex() : sqlite3MallocMutex();
  sqlite3_mutex_enter(pMutex);
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  sqlite3_mutex_leave(pMutex);
  (void)pMutex;  /* Prevent warning when SQLITE_THREADSAFE=0 */
  return SQLITE_OK;
}